

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

LightLeSample * __thiscall
pbrt::PortalImageInfiniteLight::SampleLe
          (PortalImageInfiniteLight *this,Point2f *u1,Point2f *u2,SampledWavelengths *lambda,
          Float time)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  PortalImageInfiniteLight *in_RSI;
  LightLeSample *in_RDI;
  Tuple3<pbrt::Vector3,_float> *t;
  undefined8 uVar13;
  undefined1 auVar3 [64];
  undefined1 auVar14 [56];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  undefined1 auVar8 [64];
  undefined1 auVar9 [64];
  undefined1 auVar10 [64];
  undefined1 auVar11 [64];
  undefined1 auVar12 [64];
  undefined1 auVar16 [56];
  undefined1 auVar15 [64];
  Vector3f VVar17;
  Vector3<float> VVar18;
  Point3<float> PVar19;
  SampledSpectrum SVar20;
  SampledSpectrum L;
  Float pdfPos;
  Ray ray;
  Point3f pDisk;
  Point2f cd;
  Frame wFrame;
  Float pdfDir;
  Vector3f w;
  Float duv_dw;
  Point2f uv;
  Bounds2f b;
  Float mapPDF;
  Float in_stack_fffffffffffffd68;
  Float in_stack_fffffffffffffd6c;
  LightLeSample *in_stack_fffffffffffffd70;
  Ray *ray_00;
  Point2<float> *in_stack_fffffffffffffd78;
  SampledSpectrum *L_00;
  undefined4 in_stack_fffffffffffffd80;
  undefined4 in_stack_fffffffffffffd84;
  Float FVar21;
  undefined4 in_stack_fffffffffffffd90;
  undefined4 uVar22;
  undefined4 in_stack_fffffffffffffd94;
  float s;
  Point2f *in_stack_fffffffffffffda8;
  LightLeSample *st;
  PortalImageInfiniteLight *this_00;
  Point2f *st_00;
  undefined4 in_stack_fffffffffffffe08;
  undefined4 in_stack_fffffffffffffe0c;
  undefined4 in_stack_fffffffffffffe10;
  undefined4 in_stack_fffffffffffffe14;
  Float *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe38;
  undefined4 in_stack_fffffffffffffe3c;
  Point2f *in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  undefined1 local_124 [20];
  float local_110;
  undefined8 local_108;
  float local_100;
  undefined8 local_f8;
  float local_f0;
  undefined8 local_e8;
  undefined8 local_e0;
  float local_d8;
  undefined8 local_d0;
  float local_c8;
  undefined1 local_c0 [40];
  undefined8 local_98;
  float local_90;
  undefined8 local_88;
  float local_80;
  undefined8 local_78;
  float local_70;
  undefined8 local_68;
  float local_60;
  float local_5c;
  undefined8 local_58;
  Point2f local_50;
  float local_30;
  undefined1 extraout_var [56];
  undefined1 extraout_var_00 [56];
  
  this_00 = (PortalImageInfiniteLight *)&stack0xffffffffffffffb8;
  st = in_RDI;
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
             in_stack_fffffffffffffd68);
  st_00 = &local_50;
  Point2<float>::Point2
            ((Point2<float> *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd6c,
             in_stack_fffffffffffffd68);
  Bounds2<float>::Bounds2
            ((Bounds2<float> *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
             in_stack_fffffffffffffd78,(Point2<float> *)in_stack_fffffffffffffd70);
  auVar3._0_8_ = WindowedPiecewiseConstant2D::Sample
                           ((WindowedPiecewiseConstant2D *)
                            CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                            in_stack_fffffffffffffe40,
                            (Bounds2f *)
                            CONCAT44(in_stack_fffffffffffffe3c,in_stack_fffffffffffffe38),
                            in_stack_fffffffffffffe30);
  auVar3._8_56_ = extraout_var;
  local_58 = vmovlpd_avx(auVar3._0_16_);
  auVar14 = (undefined1  [56])0x0;
  if ((local_30 != 0.0) || (NAN(local_30))) {
    VVar17 = RenderFromImage(this_00,(Point2f *)st,(Float *)in_RDI);
    local_80 = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar4._0_8_ = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar4._8_56_ = auVar14;
    local_88 = vmovlpd_avx(auVar4._0_16_);
    local_78 = local_88;
    local_70 = local_80;
    VVar18 = Tuple3<pbrt::Vector3,_float>::operator-
                       ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffffd70);
    local_90 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
    auVar5._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
    auVar5._8_56_ = auVar14;
    local_98 = vmovlpd_avx(auVar5._0_16_);
    local_68 = local_98;
    local_60 = local_90;
    if ((local_5c != 0.0) || (NAN(local_5c))) {
      local_c0._36_4_ = local_30 / local_5c;
      auVar14 = ZEXT856(0);
      VVar18 = Tuple3<pbrt::Vector3,_float>::operator-
                         ((Tuple3<pbrt::Vector3,_float> *)in_stack_fffffffffffffd70);
      local_d8 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar6._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar6._8_56_ = auVar14;
      local_e0 = vmovlpd_avx(auVar6._0_16_);
      ray_00 = (Ray *)local_c0;
      local_d0 = local_e0;
      local_c8 = local_d8;
      Frame::FromZ((Vector3f *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90));
      auVar7._0_8_ = SampleUniformDiskConcentric(in_stack_fffffffffffffda8);
      auVar7._8_56_ = extraout_var_00;
      local_e8 = vmovlpd_avx(auVar7._0_16_);
      FVar21 = in_RSI->sceneRadius;
      uVar13 = 0;
      L_00 = (SampledSpectrum *)local_124;
      Vector3<float>::Vector3
                ((Vector3<float> *)ray_00,in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68,0.0);
      VVar17 = Frame::FromLocal((Frame *)CONCAT44(in_stack_fffffffffffffe14,
                                                  in_stack_fffffffffffffe10),
                                (Vector3f *)
                                CONCAT44(in_stack_fffffffffffffe0c,in_stack_fffffffffffffe08));
      local_110 = VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
      t = VVar17.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar14 = (undefined1  [56])0x0;
      uVar22 = (undefined4)uVar13;
      s = (float)((ulong)uVar13 >> 0x20);
      auVar1._8_4_ = uVar22;
      auVar1._0_8_ = t;
      auVar1._12_4_ = s;
      local_124._12_8_ = vmovlpd_avx(auVar1);
      VVar18 = pbrt::operator*(s,t);
      local_100 = VVar18.super_Tuple3<pbrt::Vector3,_float>.z;
      auVar8._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar8._8_56_ = auVar14;
      local_108 = vmovlpd_avx(auVar8._0_16_);
      PVar19 = Point3<float>::operator+
                         ((Point3<float> *)CONCAT44(FVar21,in_stack_fffffffffffffd80),
                          (Vector3<float> *)L_00);
      local_f0 = PVar19.super_Tuple3<pbrt::Point3,_float>.z;
      auVar9._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar9._8_56_ = auVar14;
      local_f8 = vmovlpd_avx(auVar9._0_16_);
      uVar13 = 0;
      VVar18 = Tuple3<pbrt::Vector3,_float>::operator-((Tuple3<pbrt::Vector3,_float> *)ray_00);
      auVar14 = (undefined1  [56])0x0;
      auVar2._8_8_ = uVar13;
      auVar2._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      vmovlpd_avx(auVar2);
      VVar18 = pbrt::operator*(s,t);
      auVar10._0_8_ = VVar18.super_Tuple3<pbrt::Vector3,_float>._0_8_;
      auVar10._8_56_ = auVar14;
      vmovlpd_avx(auVar10._0_16_);
      PVar19 = Point3<float>::operator+
                         ((Point3<float> *)CONCAT44(FVar21,in_stack_fffffffffffffd80),
                          (Vector3<float> *)L_00);
      auVar11._0_8_ = PVar19.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar11._8_56_ = auVar14;
      vmovlpd_avx(auVar11._0_16_);
      MediumHandle::TaggedPointer
                ((MediumHandle *)ray_00,
                 (nullptr_t)CONCAT44(in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68));
      Ray::Ray((Ray *)CONCAT44(s,uVar22),(Point3f *)t,
               (Vector3f *)CONCAT44(FVar21,in_stack_fffffffffffffd80),(Float)((ulong)L_00 >> 0x20),
               (MediumHandle *)ray_00);
      Sqr<float>(in_RSI->sceneRadius);
      auVar16 = (undefined1  [56])0x0;
      auVar14 = ZEXT856(0);
      SVar20 = ImageLookup(in_RSI,st_00,(SampledWavelengths *)this_00);
      auVar15._0_8_ = SVar20.values.values._8_8_;
      auVar15._8_56_ = auVar16;
      auVar12._0_8_ = SVar20.values.values._0_8_;
      auVar12._8_56_ = auVar14;
      vmovlpd_avx(auVar12._0_16_);
      vmovlpd_avx(auVar15._0_16_);
      LightLeSample::LightLeSample
                ((LightLeSample *)CONCAT44(FVar21,in_stack_fffffffffffffd80),L_00,ray_00,
                 in_stack_fffffffffffffd6c,in_stack_fffffffffffffd68);
    }
    else {
      memset(in_RDI,0,0x98);
      LightLeSample::LightLeSample(in_stack_fffffffffffffd70);
    }
  }
  else {
    memset(in_RDI,0,0x98);
    LightLeSample::LightLeSample(in_stack_fffffffffffffd70);
  }
  return st;
}

Assistant:

LightLeSample PortalImageInfiniteLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                                 SampledWavelengths &lambda,
                                                 Float time) const {
    Float mapPDF;
    Bounds2f b(Point2f(0, 0), Point2f(1, 1));
    Point2f uv = distribution.Sample(u1, b, &mapPDF);
    if (mapPDF == 0)
        return {};

    // Convert infinite light sample point to direction
    // Note: ignore WorldToLight since we already folded it in when we
    // resampled...
    Float duv_dw;
    Vector3f w = -RenderFromImage(uv, &duv_dw);
    if (duv_dw == 0)
        return {};

    // Compute PDF for sampled infinite light direction
    Float pdfDir = mapPDF / duv_dw;

#if 0
    // Just sample within the portal.
    // This works with the light path integrator, but not BDPT :-(
    Point3f p = portal[0] + u2[0] * (portal[1] - portal[0]) +
        u2[1] * (portal[3] - portal[0]);
    // Compute _PortalImageInfiniteLight_ ray PDFs
    Ray ray(p, w, time);

    // Cosine to account for projected area of portal w.r.t. ray direction.
    Normal3f n = Normal3f(portalFrame.z);
    Float pdfPos = 1 / (Area() * AbsDot(n, w));
#else
    // Compute infinite light sample ray
    Frame wFrame = Frame::FromZ(-w);
    Point2f cd = SampleUniformDiskConcentric(u2);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));
    Ray ray(pDisk + sceneRadius * -w, w, time);

    Float pdfPos = 1 / (Pi * Sqr(sceneRadius));
#endif

    SampledSpectrum L = ImageLookup(uv, lambda);

    return LightLeSample(L, ray, pdfPos, pdfDir);
}